

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmTst<(moira::Instr)128,(moira::Mode)11,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  Ea<(moira::Mode)11,_4> ea;
  u32 local_34;
  ushort local_30;
  uint local_2c;
  
  local_30 = op & 7;
  local_34 = *addr;
  *addr = local_34 + 2;
  iVar3 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])(this);
  local_2c = uVar4 & 0xffff | iVar3 << 0x10;
  cVar2 = 't';
  lVar5 = 1;
  do {
    pcVar1 = str->ptr;
    str->ptr = pcVar1 + 1;
    *pcVar1 = cVar2;
    cVar2 = "btst"[lVar5 + 1];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if (str->style->syntax - MOIRA_MIT < 3) {
    pcVar1 = str->ptr;
    str->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
  }
  else {
    cVar2 = '.';
    lVar5 = 0;
    do {
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "$%x.l"[lVar5 + 4];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar1 = str->ptr;
    str->ptr = pcVar1 + 1;
    *pcVar1 = ' ';
  }
  else {
    iVar3 = (str->tab).raw;
    do {
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = ' ';
    } while (str->ptr < str->base + iVar3);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)11,_4> *)&local_34);
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar2 = ';';
    lVar5 = 1;
    do {
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "trap%-2s  ; (2+)"[lVar5 + 10];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmTst(StrWriter &str, u32 &addr, u16 op) const
{
    auto ea = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << ea;
    str << Av<I, M, S>{};
}